

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O0

void __thiscall
libsbox::BindRule::
BindRule<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (BindRule *this,Value *value)

{
  bool bVar1;
  int iVar2;
  ContextManager *pCVar3;
  Type pGVar4;
  Ch *pCVar5;
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [39];
  allocator<char> local_49;
  string local_48 [48];
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_18;
  Value *value_local;
  BindRule *this_local;
  
  local_18 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)value;
  value_local = (Value *)this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->outside_);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_18);
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,"JSON is incorrect",&local_49);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"inside");
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"JSON is incorrect",&local_71);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"inside");
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsString(pGVar4);
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_98,"JSON is incorrect",&local_99);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"inside");
  pCVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar4);
  std::__cxx11::string::operator=((string *)this,pCVar5);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"outside");
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"JSON is incorrect",&local_c1);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"outside");
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsString(pGVar4);
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e8,"JSON is incorrect",&local_e9);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"outside");
  pCVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar4);
  std::__cxx11::string::operator=((string *)&this->outside_,pCVar5);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_18,"flags");
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_110,"JSON is incorrect",&local_111);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"flags");
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsInt(pGVar4);
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_138,"JSON is incorrect",&local_139);
    (*(code *)**(undefined8 **)pCVar3)(pCVar3,local_138);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator(&local_139);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(local_18,"flags");
  iVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(pGVar4);
  this->flags_ = iVar2;
  return;
}

Assistant:

BindRule::BindRule(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(inside_, value, "inside", String);
    GET_MEMBER(outside_, value, "outside", String);
    GET_MEMBER(flags_, value, "flags", Int);
}